

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex.h
# Opt level: O0

void __thiscall
alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::
link_data_nodes(Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
                *this,data_node_type *old_leaf,data_node_type *left_leaf,data_node_type *right_leaf)

{
  data_node_type *right_leaf_local;
  data_node_type *left_leaf_local;
  data_node_type *old_leaf_local;
  Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
  *this_local;
  
  if (old_leaf->prev_leaf_ != (self_type *)0x0) {
    old_leaf->prev_leaf_->next_leaf_ = left_leaf;
  }
  left_leaf->prev_leaf_ = old_leaf->prev_leaf_;
  left_leaf->next_leaf_ = right_leaf;
  right_leaf->prev_leaf_ = left_leaf;
  right_leaf->next_leaf_ = old_leaf->next_leaf_;
  if (old_leaf->next_leaf_ != (self_type *)0x0) {
    old_leaf->next_leaf_->prev_leaf_ = right_leaf;
  }
  return;
}

Assistant:

void link_data_nodes(const data_node_type* old_leaf,
                       data_node_type* left_leaf, data_node_type* right_leaf) {
    if (old_leaf->prev_leaf_ != nullptr) {
      old_leaf->prev_leaf_->next_leaf_ = left_leaf;
    }
    left_leaf->prev_leaf_ = old_leaf->prev_leaf_;
    left_leaf->next_leaf_ = right_leaf;
    right_leaf->prev_leaf_ = left_leaf;
    right_leaf->next_leaf_ = old_leaf->next_leaf_;
    if (old_leaf->next_leaf_ != nullptr) {
      old_leaf->next_leaf_->prev_leaf_ = right_leaf;
    }
  }